

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O2

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
ready_to_deregister_notify
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this,coop_t *coop)

{
  main_thread_sync_objects_t *__mutex;
  coop_t *local_20;
  
  __mutex = &this->m_sync_objects;
  local_20 = coop;
  std::mutex::lock(&__mutex->m_lock);
  std::deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::push_back
            (&this->m_final_dereg_coops,&local_20);
  wakeup_if_waiting(__mutex);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::ready_to_deregister_notify(
	coop_t * coop )
	{
		std::lock_guard< std::mutex > lock( m_sync_objects.m_lock );
		m_final_dereg_coops.push_back( coop );

		wakeup_if_waiting( m_sync_objects );
	}